

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O2

void __thiscall Snes_Spc::set_output(Snes_Spc *this,sample_t_conflict1 *out,int size)

{
  int *piVar1;
  uint8_t *puVar2;
  sample_t_conflict1 sVar3;
  sample_t_conflict1 *psVar4;
  ulong uVar5;
  sample_t_conflict1 *psVar6;
  char *pcVar7;
  
  piVar1 = &(this->m).extra_clocks;
  *piVar1 = *piVar1 & 0x1f;
  if (out != (sample_t_conflict1 *)0x0) {
    pcVar7 = (char *)(out + size);
    (this->m).buf_begin = out;
    (this->m).buf_end = (sample_t_conflict1 *)pcVar7;
    psVar6 = (this->m).extra_buf;
    psVar4 = (this->m).extra_pos;
    for (; (psVar6 < psVar4 && (out < pcVar7)); out = out + 1) {
      sVar3 = *psVar6;
      psVar6 = psVar6 + 1;
      *out = sVar3;
    }
    if (pcVar7 <= out) {
      out = (this->dsp).m.extra;
      for (; psVar6 < psVar4; psVar6 = psVar6 + 1) {
        *out = *psVar6;
        out = out + 1;
      }
      pcVar7 = this->reg_times;
    }
    Spc_Dsp::set_output(&this->dsp,out,(int)((ulong)((long)pcVar7 - (long)out) >> 1));
    return;
  }
  for (uVar5 = 0x8c0; uVar5 < 0x8d0; uVar5 = uVar5 + 2) {
    puVar2 = (this->dsp).m.regs + uVar5;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
  }
  (this->m).extra_pos = (sample_t_conflict1 *)((this->dsp).m.regs + uVar5);
  (this->m).buf_begin = (sample_t_conflict1 *)0x0;
  Spc_Dsp::set_output(&this->dsp,(sample_t_conflict1 *)0x0,0);
  return;
}

Assistant:

void Snes_Spc::set_output( sample_t* out, int size )
{
	require( (size & 1) == 0 ); // size must be even
	
	m.extra_clocks &= clocks_per_sample - 1;
	if ( out )
	{
		sample_t const* out_end = out + size;
		m.buf_begin = out;
		m.buf_end   = out_end;
		
		// Copy extra to output
		sample_t const* in = m.extra_buf;
		while ( in < m.extra_pos && out < out_end )
			*out++ = *in++;
		
		// Handle output being full already
		if ( out >= out_end )
		{
			// Have DSP write to remaining extra space
			out     = dsp.extra();
			out_end = &dsp.extra() [extra_size];
			
			// Copy any remaining extra samples as if DSP wrote them
			while ( in < m.extra_pos )
				*out++ = *in++;
			assert( out <= out_end );
		}
		
		dsp.set_output( out, int(out_end - out) );
	}
	else
	{
		reset_buf();
	}
}